

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Platform.h
# Opt level: O1

bool senjo::StringParam(string *name,string *value,char **params,bool *invalid)

{
  size_t __n;
  char cVar1;
  int iVar2;
  bool bVar3;
  char *pcVar4;
  char *pcVar5;
  
  __n = name->_M_string_length;
  if ((((__n == 0) || (pcVar4 = *params, pcVar4 == (char *)0x0)) ||
      (iVar2 = strncmp(pcVar4,(name->_M_dataplus)._M_p,__n), iVar2 != 0)) ||
     ((pcVar4[__n] != '\0' && (iVar2 = isspace((int)pcVar4[__n]), iVar2 == 0)))) {
    bVar3 = false;
  }
  else {
    *params = pcVar4 + __n;
    cVar1 = pcVar4[__n];
    bVar3 = true;
    if (cVar1 != '\0') {
      pcVar4 = pcVar4 + __n;
      do {
        pcVar4 = pcVar4 + 1;
        iVar2 = isspace((int)cVar1);
        if (iVar2 == 0) break;
        *params = pcVar4;
        cVar1 = *pcVar4;
      } while (cVar1 != '\0');
    }
  }
  if (bVar3 != false) {
    pcVar4 = *params;
    if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
      *invalid = true;
    }
    else {
      cVar1 = *pcVar4;
      pcVar5 = pcVar4;
      while (cVar1 != '\0') {
        pcVar5 = pcVar5 + 1;
        iVar2 = isspace((int)cVar1);
        if (iVar2 != 0) break;
        *params = pcVar5;
        cVar1 = *pcVar5;
      }
      std::__cxx11::string::_M_replace((ulong)value,0,(char *)value->_M_string_length,(ulong)pcVar4)
      ;
      pcVar4 = *params;
      if (pcVar4 != (char *)0x0) {
        cVar1 = *pcVar4;
        while (cVar1 != '\0') {
          pcVar4 = pcVar4 + 1;
          iVar2 = isspace((int)cVar1);
          if (iVar2 == 0) {
            return bVar3;
          }
          *params = pcVar4;
          cVar1 = *pcVar4;
        }
      }
    }
  }
  return bVar3;
}

Assistant:

static inline bool StringParam(const std::string& name, std::string& value,
                               const char*& params, bool& invalid)
{
  if (!ParamMatch(name, params)) {
    return false;
  }
  if (!params || !*params) {
    invalid = true;
  }
  else {
    const char* begin = params;
    NextSpace(params);
    value.assign(begin, (params - begin));
    NextWord(params);
  }
  return true;
}